

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>>
               (long *rangeBegin,Id<int> *patternTuple,undefined4 depth,undefined8 context)

{
  bool bVar1;
  anon_class_16_2_afc162f5 func;
  undefined4 local_24;
  undefined4 *local_20;
  undefined8 local_18;
  
  local_20 = &local_24;
  local_24 = depth;
  local_18 = context;
  bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>>(int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,int,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>&,std::integer_sequence<unsigned_long,0ul,1ul>)
          ::{lambda(auto:1&&,auto:2&&)#1}::operator()(&local_20,(int *)*rangeBegin,patternTuple + 1)
  ;
  if (bVar1) {
    bVar1 = matchPatternRangeImpl<0ul,0ul,1ul,int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>>(int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,int,matchit::impl::Context<int_const*,bool,mathiu::impl::Fraction_const*,bool,mathiu::impl::Symbol_const*,bool,mathiu::impl::Sum_const*,bool,mathiu::impl::Product_const*,bool,mathiu::impl::Power_const*,bool,mathiu::impl::Sin_const*,bool,mathiu::impl::Log_const*,bool,mathiu::impl::Pi_const*,bool,mathiu::impl::E_const*,bool,mathiu::impl::Infinity_const*,bool>&,std::integer_sequence<unsigned_long,0ul,1ul>)
            ::{lambda(auto:1&&,auto:2&&)#1}::operator()
                      (&local_20,(int *)(*rangeBegin + 4),patternTuple);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }